

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CheckType(LlvmCompilationContext *ctx,ExprBase *node,LLVMValueRef value)

{
  TypeBase *type;
  LLVMTypeRef pLVar1;
  
  if (value == (LLVMValueRef)0x0) {
    if (node->type != ctx->ctx->typeVoid) {
      __assert_fail("node->type == ctx.ctx.typeVoid",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x27b,
                    "LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)");
    }
  }
  else {
    type = GetStackType(ctx,node->type);
    pLVar1 = CompileLlvmType(ctx,type);
    if (pLVar1 != (LLVMTypeRef)&placeholderType) {
      printf("Wrong result type\nExpected: ");
      printf("\n     Got: ");
      putchar(10);
      __assert_fail("!\"wrong result type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x28b,
                    "LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)");
    }
  }
  return value;
}

Assistant:

LLVMValueRef CheckType(LlvmCompilationContext &ctx, ExprBase *node, LLVMValueRef value)
{
	if(!value)
	{
		assert(node->type == ctx.ctx.typeVoid);

		return NULL;
	}

	LLVMTypeRef valueType = LLVMTypeOf(value);
	LLVMTypeRef expectedType = CompileLlvmType(ctx, GetStackType(ctx, node->type));

	if(valueType != expectedType)
	{
		printf("Wrong result type\nExpected: ");
		LLVMDumpType(expectedType);
		printf("\n     Got: ");
		LLVMDumpType(valueType);
		printf("\n");

		assert(!"wrong result type");
	}

	return value;
}